

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

void __thiscall FConsoleAlias::PrintAlias(FConsoleAlias *this)

{
  if (*(int *)(this->m_Command[0].Chars + -0xc) != 0) {
    Printf("\x1cK%s : %s\n",(this->super_FConsoleCommand).m_Name);
  }
  if (*(int *)(this->m_Command[1].Chars + -0xc) != 0) {
    Printf("\x1cI%s : %s\n",(this->super_FConsoleCommand).m_Name);
    return;
  }
  return;
}

Assistant:

void FConsoleAlias::PrintAlias ()
{
	if (m_Command[0].IsNotEmpty())
	{
		Printf (TEXTCOLOR_YELLOW "%s : %s\n", m_Name, m_Command[0].GetChars());
	}
	if (m_Command[1].IsNotEmpty())
	{
		Printf (TEXTCOLOR_ORANGE "%s : %s\n", m_Name, m_Command[1].GetChars());
	}
}